

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadeFragments
          (BuiltinVariableShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int local_d8;
  int local_d4;
  int fragNdx_1;
  int packetNdx_1;
  Vec4 color;
  int local_b0;
  int local_ac;
  int fragNdx;
  int packetNdx;
  Vec4 colors [4];
  Vec4 yellow;
  Vec4 blue;
  Vec4 green;
  Vec4 red;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  BuiltinVariableShader *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[3].m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&fragNdx,(Vector<float,_4> *)(colors[3].m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[0].m_data + 2),(Vector<float,_4> *)(green.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[1].m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[2].m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2));
  if ((*(int *)&(this->super_ShaderProgram).field_0x154 == 0) ||
     (*(int *)&(this->super_ShaderProgram).field_0x154 == 1)) {
    for (local_ac = 0; local_ac < numPackets; local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
        rr::readVarying<float>((rr *)(color.m_data + 2),packets + local_ac,context,0,local_b0);
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,local_ac,local_b0,0,(Vector<float,_4> *)(color.m_data + 2));
      }
    }
  }
  else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 2) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&fragNdx_1,
               (Vector<float,_4> *)(&fragNdx + (long)(context->primitiveID % 4) * 4));
    for (local_d4 = 0; local_d4 < numPackets; local_d4 = local_d4 + 1) {
      for (local_d8 = 0; local_d8 < 4; local_d8 = local_d8 + 1) {
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,local_d4,local_d8,0,(Vector<float,_4> *)&fragNdx_1);
      }
    }
  }
  return;
}

Assistant:

void BuiltinVariableShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { yellow, red, green, blue };

	if (m_test == TEST_POINT_SIZE || m_test == TEST_PRIMITIVE_ID_IN)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx));
	}
	else if (m_test == TEST_PRIMITIVE_ID)
	{
		const tcu::Vec4 color = colors[context.primitiveID % 4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else
		DE_ASSERT(DE_FALSE);
}